

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::filterTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  bool bVar1;
  reference this;
  long *in_RCX;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_RSI;
  TestCaseHandle *in_RDI;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_00000028;
  TestCaseHandle *testCase;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> filtered;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  TestCaseHandle *testCase_00;
  size_type in_stack_ffffffffffffff98;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_58;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_50;
  long *local_20;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_10;
  
  testCase_00 = in_RDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
            ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)0x193af0);
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size(local_10);
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_50 = local_10;
  local_58._M_current =
       (TestCaseHandle *)
       std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                 (in_stack_ffffffffffffff68);
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
            (in_stack_ffffffffffffff68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      (**(code **)(*local_20 + 0x90))();
      (**(code **)(*local_20 + 0x98))();
      createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
                (in_stack_00000028,in_stack_00000020,in_stack_00000018);
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~vector
                ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                 testCase_00);
      return (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)in_RDI;
    }
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
           ::operator*(&local_58);
    bVar1 = TestSpec::hasFilters((TestSpec *)0x193b6b);
    if (bVar1) {
LAB_00193b91:
      bVar1 = TestSpec::hasFilters((TestSpec *)0x193b9e);
      if ((bVar1) &&
         (in_stack_ffffffffffffff7e =
               anon_unknown_26::matchTest
                         (testCase_00,
                          (TestSpec *)
                          CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT24(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78))),
                          (IConfig *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
         (bool)in_stack_ffffffffffffff7e)) goto LAB_00193bcb;
    }
    else {
      TestCaseHandle::getTestCaseInfo(this);
      in_stack_ffffffffffffff7f = TestCaseInfo::isHidden((TestCaseInfo *)0x193b81);
      if ((bool)in_stack_ffffffffffffff7f) goto LAB_00193b91;
LAB_00193bcb:
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                 testCase_00,
                 (value_type *)
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(in_stack_ffffffffffffff7e,
                                   CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))));
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

std::vector<TestCaseHandle> filterTests( std::vector<TestCaseHandle> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCaseHandle> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.getTestCaseInfo().isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return createShard(filtered, config.shardCount(), config.shardIndex());
    }